

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool BasePort::HardwareVersionValid(unsigned_long hver)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((long)SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    return false;
  }
  uVar2 = (long)SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  bVar4 = true;
  if (*SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start != hver) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (uVar2 + (uVar2 == 0) == uVar3) break;
      uVar1 = uVar3 + 1;
    } while (SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar3] != hver);
    bVar4 = uVar3 < uVar2;
  }
  return bVar4;
}

Assistant:

bool BasePort::HardwareVersionValid(unsigned long hver)
{
    bool valid = false;
    for (size_t i = 0; i < SupportedHardware.size(); i++) {
        if (SupportedHardware[i] == hver) {
            valid = true;
            break;
        }
    }
    return valid;
}